

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_system_memory.c
# Opt level: O0

SUNErrCode
SUNMemoryHelper_GetAllocStats_Sys
          (SUNMemoryHelper helper,SUNMemoryType mem_type,unsigned_long *num_allocations,
          unsigned_long *num_deallocations,size_t *bytes_allocated,size_t *bytes_high_watermark)

{
  SUNContext sunctx_local_scope_;
  size_t *bytes_high_watermark_local;
  size_t *bytes_allocated_local;
  unsigned_long *num_deallocations_local;
  unsigned_long *num_allocations_local;
  SUNMemoryType mem_type_local;
  SUNMemoryHelper helper_local;
  
  *num_allocations = *helper->content;
  *num_deallocations = *(unsigned_long *)((long)helper->content + 8);
  *bytes_allocated = *(size_t *)((long)helper->content + 0x10);
  *bytes_high_watermark = *(size_t *)((long)helper->content + 0x18);
  return 0;
}

Assistant:

SUNErrCode SUNMemoryHelper_GetAllocStats_Sys(
  SUNMemoryHelper helper, SUNDIALS_MAYBE_UNUSED SUNMemoryType mem_type,
  unsigned long* num_allocations, unsigned long* num_deallocations,
  size_t* bytes_allocated, size_t* bytes_high_watermark)
{
  SUNFunctionBegin(helper->sunctx);
  SUNAssert(mem_type == SUNMEMTYPE_HOST, SUN_ERR_ARG_INCOMPATIBLE);
  *num_allocations      = SUNHELPER_CONTENT(helper)->num_allocations;
  *num_deallocations    = SUNHELPER_CONTENT(helper)->num_deallocations;
  *bytes_allocated      = SUNHELPER_CONTENT(helper)->bytes_allocated;
  *bytes_high_watermark = SUNHELPER_CONTENT(helper)->bytes_high_watermark;
  return SUN_SUCCESS;
}